

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMovemRgEa<(moira::Instr)77,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 addr;
  int i;
  long lVar2;
  AEStackFrame frame;
  
  uVar1 = readI<(moira::Size)2>(this);
  addr = computeEA<(moira::Mode)7,(moira::Size)4,0ul>(this,opcode & 7);
  if (((short)uVar1 != 0 & (byte)addr) != 0) {
    this->fcl = '\x01';
    frame = makeFrame<72ul>(this,addr);
    execAddressError(this,frame,0);
    return;
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    if ((uVar1 >> ((uint)lVar2 & 0x1f) & 1) != 0) {
      writeM<(moira::MemSpace)1,(moira::Size)4,0ul>
                (this,addr,*(u32 *)((long)this->exec + lVar2 * 4 + -0x58));
      addr = addr + 4;
    }
  }
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execMovemRgEa(u16 opcode)
{
    int dst  = _____________xxx(opcode);
    u16 mask = readI<Word>();

    switch (M) {

        case 4: // -(An)
        {
            u32 ea = readA(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea - S));
                return;
            }

            for(int i = 15; i >= 0; i--) {

                if (mask & (0x8000 >> i)) {
                    ea -= S;
                    writeM <M, S, MIMIC_MUSASHI ? REVERSE : 0> (ea, reg.r[i]);
                }
            }
            writeA(dst, ea);
            break;
        }
        default:
        {
            u32 ea = computeEA<M,S>(dst);
            
            // Check for address error
            if (mask && misaligned<S>(ea)) {
                setFC<M>();
                execAddressError(makeFrame <AE_INC_PC|AE_WRITE> (ea));
                return;
            }
  
            for(int i = 0; i < 16; i++) {
                
                if (mask & (1 << i)) {
                    writeM <M, S> (ea, reg.r[i]);
                    ea += S;
                }
            }
            break;
        }
    }
    prefetch<POLLIPL>();
}